

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

TestMiniParseResult *
google::protobuf::internal::TcParser::TestMiniParse
          (TestMiniParseResult *__return_storage_ptr__,MessageLite *msg,char *ptr,ParseContext *ctx,
          TcFieldData data,TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  char cVar2;
  TailCallParseFunc p_Var3;
  FieldEntry *pFVar4;
  char *pcVar5;
  TcFieldData TVar6;
  uint uVar7;
  long lVar8;
  uint7 uVar9;
  ParseContext *pPVar10;
  
  __return_storage_ptr__->found_entry = (FieldEntry *)0x0;
  __return_storage_ptr__->ptr = (char *)0x0;
  __return_storage_ptr__->called_func = (TailCallParseFunc)0x0;
  *(undefined8 *)&__return_storage_ptr__->tag = 0;
  bVar1 = *ptr;
  uVar7 = (uint)bVar1;
  pPVar10 = (ParseContext *)(ptr + 1);
  if ((char)bVar1 < '\0') {
    uVar9 = (uint7)(((ulong)bVar1 << 0x39) >> 8);
    cVar2 = *(char *)&(((ParseContext *)(ptr + 1))->super_EpsCopyInputStream).limit_end_;
    lVar8 = CONCAT71(uVar9,cVar2);
    if (cVar2 < '\0') {
      uVar9 = uVar9 >> 7 | (uint7)((ulong)(lVar8 << 0x39) >> 8);
      lVar8 = CONCAT71(uVar9,ptr[2]);
      if (ptr[2] < '\0') {
        uVar9 = uVar9 >> 7 | (uint7)((ulong)(lVar8 << 0x39) >> 8);
        lVar8 = CONCAT71(uVar9,ptr[3]);
        if (ptr[3] < '\0') {
          uVar9 = uVar9 >> 7 | (uint7)((ulong)(lVar8 << 0x39) >> 8);
          if (ptr[4] < '\0') {
            uVar7 = 0;
            pPVar10 = (ParseContext *)0x0;
          }
          else {
            uVar7 = (int)CONCAT71(uVar9,ptr[4]) << 0x1c | (uint)(uVar9 >> 0x1c);
            ptr = ptr + 5;
            pPVar10 = (ParseContext *)ptr;
          }
        }
        else {
          uVar7 = (int)lVar8 << 0x15 | (uint)(uVar9 >> 0x23);
          ptr = ptr + 4;
          pPVar10 = (ParseContext *)ptr;
        }
      }
      else {
        uVar7 = (int)lVar8 << 0xe | (uint)(uVar9 >> 0x2a);
        ptr = ptr + 3;
        pPVar10 = (ParseContext *)ptr;
      }
    }
    else {
      uVar7 = (int)lVar8 << 7 | (uint)(((ulong)bVar1 << 0x39) >> 0x39);
      ptr = ptr + 2;
      pPVar10 = (ParseContext *)ptr;
    }
  }
  if (pPVar10 == (ParseContext *)0x0) {
    *(undefined8 *)&__return_storage_ptr__->tag = 0;
    __return_storage_ptr__->found_entry = (FieldEntry *)0x0;
    __return_storage_ptr__->ptr = (char *)0x0;
    __return_storage_ptr__->called_func = Error;
    pcVar5 = Error(msg,(char *)msg,(ParseContext *)ptr,(TcFieldData)ctx,table,hasbits);
  }
  else {
    pFVar4 = FindFieldEntry(table,uVar7 >> 3);
    if (pFVar4 == (FieldEntry *)0x0) {
      p_Var3 = table->fallback;
      __return_storage_ptr__->called_func = p_Var3;
      __return_storage_ptr__->tag = uVar7;
      __return_storage_ptr__->found_entry = (FieldEntry *)0x0;
      __return_storage_ptr__->ptr = (char *)0x0;
      pcVar5 = (*p_Var3)(msg,(char *)pPVar10,ctx,(TcFieldData)SUB48(uVar7,0),table,hasbits);
    }
    else {
      TVar6.field_0.data._4_4_ = (int)pFVar4 - (int)table;
      TVar6.field_0.data._0_4_ = uVar7;
      p_Var3 = *(TailCallParseFunc *)
                (MiniParse<true>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)
                 ::kMiniParseTable + (ulong)(pFVar4->type_card & 0xf) * 8);
      __return_storage_ptr__->called_func = p_Var3;
      __return_storage_ptr__->tag = uVar7;
      __return_storage_ptr__->found_entry = pFVar4;
      __return_storage_ptr__->ptr = (char *)0x0;
      pcVar5 = (*p_Var3)(msg,(char *)pPVar10,ctx,TVar6,table,hasbits);
    }
  }
  __return_storage_ptr__->ptr = pcVar5;
  return __return_storage_ptr__;
}

Assistant:

PROTOBUF_NOINLINE TcParser::TestMiniParseResult TcParser::TestMiniParse(
    PROTOBUF_TC_PARAM_DECL) {
  TestMiniParseResult result = {};
  data.data = reinterpret_cast<uintptr_t>(&result);
  result.ptr = MiniParse<true>(PROTOBUF_TC_PARAM_PASS);
  return result;
}